

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

void Wlc_NtkDupOneBuffer(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,Wlc_Obj_t *pObj,int iFanin,Vec_Int_t *vFanins,
                        int fIsFi)

{
  int Id;
  Wlc_Obj_t *pObj_00;
  Wlc_Obj_t *pObjNew;
  int iObj;
  int fIsFi_local;
  Vec_Int_t *vFanins_local;
  int iFanin_local;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  Wlc_Ntk_t *pNew_local;
  
  Id = Wlc_ObjAlloc(pNew,7,(uint)(*(ushort *)pObj >> 6 & 1),pObj->End,pObj->Beg);
  pObj_00 = Wlc_NtkObj(pNew,Id);
  Vec_IntFill(vFanins,1,iFanin);
  Wlc_ObjAddFanins(pNew,pObj_00,vFanins);
  Wlc_ObjSetCo(pNew,pObj_00,fIsFi);
  return;
}

Assistant:

void Wlc_NtkDupOneBuffer( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, Wlc_Obj_t * pObj, int iFanin, Vec_Int_t * vFanins, int fIsFi )
{
    int iObj = Wlc_ObjAlloc( pNew, WLC_OBJ_BUF, pObj->Signed, pObj->End, pObj->Beg );
    Wlc_Obj_t * pObjNew = Wlc_NtkObj( pNew, iObj );
    Vec_IntFill( vFanins, 1, iFanin );
    Wlc_ObjAddFanins( pNew, pObjNew, vFanins );
    Wlc_ObjSetCo( pNew, pObjNew, fIsFi );
}